

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arc.c
# Opt level: O3

error builtin_multiply(vector *vargs,atom *result)

{
  size_t sVar1;
  anon_union_8_9_1d3277aa_for_value *paVar2;
  double dVar3;
  
  sVar1 = vargs->size;
  if (sVar1 == 0) {
    dVar3 = 1.0;
  }
  else {
    paVar2 = &vargs->data->value;
    dVar3 = 1.0;
    do {
      if (((atom *)(paVar2 + -1))->type != T_NUM) {
        return ERROR_TYPE;
      }
      dVar3 = dVar3 * paVar2->number;
      paVar2 = paVar2 + 2;
      sVar1 = sVar1 - 1;
    } while (sVar1 != 0);
  }
  result->type = T_NUM;
  (result->value).number = dVar3;
  return ERROR_OK;
}

Assistant:

error builtin_multiply(struct vector *vargs, atom *result)
{
	double r = 1;
	size_t i;
	for (i = 0; i < vargs->size; i++) {
		if (vargs->data[i].type != T_NUM) return ERROR_TYPE;
		r *= vargs->data[i].value.number;
	}
	*result = make_number(r);
	return ERROR_OK;
}